

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

int32_t icu_63::calcNameSetLength
                  (uint16_t *tokens,uint16_t tokenCount,uint8_t *tokenStrings,int8_t *tokenLengths,
                  uint32_t *set,uint8_t **pLine,uint8_t *lineLimit)

{
  int iVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ushort uVar5;
  uint8_t **ppuVar6;
  uint8_t **ppuVar7;
  
  ppuVar7 = *(uint8_t ***)set;
  if (ppuVar7 == pLine) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    ppuVar6 = ppuVar7;
    do {
      ppuVar7 = (uint8_t **)((long)ppuVar6 + 1);
      bVar3 = *(byte *)ppuVar6;
      uVar4 = (ulong)bVar3;
      if (bVar3 == 0x3b) break;
      if (bVar3 < tokenCount) {
        uVar5 = tokens[(ushort)bVar3];
        if (uVar5 == 0xfffe) {
          ppuVar7 = (uint8_t **)((long)ppuVar6 + 2);
          uVar4 = (ulong)CONCAT11(bVar3,*(byte *)((long)ppuVar6 + 1));
          uVar5 = tokens[uVar4];
        }
        if (uVar5 == 0xffff) {
          *(uint *)(gNameSet + ((uint)(uVar4 >> 3) & 0x1c)) =
               *(uint *)(gNameSet + ((uint)(uVar4 >> 3) & 0x1c)) | 1 << ((byte)uVar4 & 0x1f);
          goto LAB_003139e6;
        }
        if (tokenLengths == (int8_t *)0x0) {
          bVar3 = tokenStrings[uVar5];
          if (bVar3 == 0) {
            uVar2 = 0;
          }
          else {
            uVar2 = 0;
            do {
              *(uint *)(gNameSet + (bVar3 >> 3 & 0x1c)) =
                   *(uint *)(gNameSet + (bVar3 >> 3 & 0x1c)) | 1 << (bVar3 & 0x1f);
              bVar3 = tokenStrings[uVar2 + (ulong)uVar5 + 1];
              uVar2 = uVar2 + 1;
            } while (bVar3 != 0);
          }
        }
        else {
          uVar2 = (ulong)(uint)(int)tokenLengths[uVar4];
          if ((int)tokenLengths[uVar4] == 0) {
            bVar3 = tokenStrings[uVar5];
            if (bVar3 == 0) {
              uVar2 = 0;
            }
            else {
              uVar2 = 0;
              do {
                *(uint *)(gNameSet + (bVar3 >> 3 & 0x1c)) =
                     *(uint *)(gNameSet + (bVar3 >> 3 & 0x1c)) | 1 << (bVar3 & 0x1f);
                bVar3 = tokenStrings[uVar2 + (ulong)uVar5 + 1];
                uVar2 = uVar2 + 1;
              } while (bVar3 != 0);
            }
            tokenLengths[uVar4] = (int8_t)uVar2;
          }
        }
        iVar1 = (int)uVar2 + iVar1;
      }
      else {
        *(uint *)(gNameSet + (ulong)(bVar3 >> 5) * 4) =
             *(uint *)(gNameSet + (ulong)(bVar3 >> 5) * 4) | 1 << (bVar3 & 0x1f);
LAB_003139e6:
        iVar1 = iVar1 + 1;
      }
      ppuVar6 = ppuVar7;
    } while (ppuVar7 != pLine);
  }
  *(uint8_t ***)set = ppuVar7;
  return iVar1;
}

Assistant:

static int32_t
calcNameSetLength(const uint16_t *tokens, uint16_t tokenCount, const uint8_t *tokenStrings, int8_t *tokenLengths,
                  uint32_t set[8],
                  const uint8_t **pLine, const uint8_t *lineLimit) {
    const uint8_t *line=*pLine;
    int32_t length=0, tokenLength;
    uint16_t c, token;

    while(line!=lineLimit && (c=*line++)!=(uint8_t)';') {
        if(c>=tokenCount) {
            /* implicit letter */
            SET_ADD(set, c);
            ++length;
        } else {
            token=tokens[c];
            if(token==(uint16_t)(-2)) {
                /* this is a lead byte for a double-byte token */
                c=c<<8|*line++;
                token=tokens[c];
            }
            if(token==(uint16_t)(-1)) {
                /* explicit letter */
                SET_ADD(set, c);
                ++length;
            } else {
                /* count token word */
                if(tokenLengths!=NULL) {
                    /* use cached token length */
                    tokenLength=tokenLengths[c];
                    if(tokenLength==0) {
                        tokenLength=calcStringSetLength(set, (const char *)tokenStrings+token);
                        tokenLengths[c]=(int8_t)tokenLength;
                    }
                } else {
                    tokenLength=calcStringSetLength(set, (const char *)tokenStrings+token);
                }
                length+=tokenLength;
            }
        }
    }

    *pLine=line;
    return length;
}